

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdump::OnFunctionSymbol
          (BinaryReaderObjdump *this,Index index,uint32_t flags,string_view name,Index func_index)

{
  Result RVar1;
  
  if (name.size_ == 0) {
    name = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,func_index)
    ;
  }
  PrintDetails(this,"   - %d: F <%.*s> func=%u",(ulong)index,name.size_ & 0xffffffff,name.data_,
               func_index);
  RVar1 = PrintSymbolFlags(this,flags);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderObjdump::OnFunctionSymbol(Index index,
                                             uint32_t flags,
                                             string_view name,
                                             Index func_index) {
  if (name.empty()) {
    name = GetFunctionName(func_index);
  }
  PrintDetails("   - %d: F <" PRIstringview "> func=%" PRIindex, index,
               WABT_PRINTF_STRING_VIEW_ARG(name), func_index);
  return PrintSymbolFlags(flags);
}